

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::HistogramTest_bucket_counts_not_reset_by_collection_Test::TestBody
          (HistogramTest_bucket_counts_not_reset_by_collection_Test *this)

{
  initializer_list<double> __l;
  bool bVar1;
  char *pcVar2;
  reference lhs;
  AssertHelper local_268;
  Message local_260;
  uint local_254;
  undefined1 local_250 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_238;
  Message local_230;
  uint local_224;
  size_type local_220;
  undefined1 local_218 [8];
  AssertionResult gtest_ar;
  Histogram h;
  ClientMetric metric;
  allocator<double> local_a9;
  double local_a8 [2];
  iterator local_98;
  size_type local_90;
  vector<double,_std::allocator<double>_> local_88;
  undefined1 local_70 [8];
  Histogram histogram;
  HistogramTest_bucket_counts_not_reset_by_collection_Test *this_local;
  
  local_a8[0] = 1.0;
  local_a8[1] = 2.0;
  local_98 = local_a8;
  local_90 = 2;
  histogram.sum_.value_._M_i = (atomic<double>)(atomic<double>)this;
  std::allocator<double>::allocator(&local_a9);
  __l._M_len = local_90;
  __l._M_array = local_98;
  std::vector<double,_std::allocator<double>_>::vector(&local_88,__l,&local_a9);
  Histogram::Histogram((Histogram *)local_70,&local_88);
  std::vector<double,_std::allocator<double>_>::~vector(&local_88);
  std::allocator<double>::~allocator(&local_a9);
  Histogram::Observe((Histogram *)local_70,1.5);
  Histogram::Collect((ClientMetric *)&metric.timestamp_ms,(Histogram *)local_70);
  ClientMetric::~ClientMetric((ClientMetric *)&metric.timestamp_ms);
  Histogram::Observe((Histogram *)local_70,1.5);
  Histogram::Collect((ClientMetric *)
                     &h.bucket.
                      super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(Histogram *)local_70);
  ClientMetric::Histogram::Histogram
            ((Histogram *)&gtest_ar.message_,
             (Histogram *)
             &metric.summary.quantile.
              super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_220 = std::
              vector<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
              ::size((vector<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
                      *)&h.sample_sum);
  local_224 = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_218,"h.bucket.size()","3U",&local_220,&local_224);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
  if (!bVar1) {
    testing::Message::Message(&local_230);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_218);
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/histogram_test.cc"
               ,0x47,pcVar2);
    testing::internal::AssertHelper::operator=(&local_238,&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    testing::Message::~Message(&local_230);
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
  if (gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    lhs = std::
          vector<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
          ::at((vector<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
                *)&h.sample_sum,1);
    local_254 = 2;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
              ((EqHelper *)local_250,"h.bucket.at(1).cumulative_count","2U",&lhs->cumulative_count,
               &local_254);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
    if (!bVar1) {
      testing::Message::Message(&local_260);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_250);
      testing::internal::AssertHelper::AssertHelper
                (&local_268,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/histogram_test.cc"
                 ,0x48,pcVar2);
      testing::internal::AssertHelper::operator=(&local_268,&local_260);
      testing::internal::AssertHelper::~AssertHelper(&local_268);
      testing::Message::~Message(&local_260);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 0;
  }
  ClientMetric::Histogram::~Histogram((Histogram *)&gtest_ar.message_);
  ClientMetric::~ClientMetric
            ((ClientMetric *)
             &h.bucket.
              super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Histogram::~Histogram((Histogram *)local_70);
  return;
}

Assistant:

TEST(HistogramTest, bucket_counts_not_reset_by_collection) {
  Histogram histogram{{1, 2}};
  histogram.Observe(1.5);
  histogram.Collect();
  histogram.Observe(1.5);
  auto metric = histogram.Collect();
  auto h = metric.histogram;
  ASSERT_EQ(h.bucket.size(), 3U);
  EXPECT_EQ(h.bucket.at(1).cumulative_count, 2U);
}